

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# otherFun.cpp
# Opt level: O2

int set_noblock(int sockfd)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  
  if (sockfd < 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"sockfd is invailed");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar1 = -1;
  }
  else {
    uVar2 = fcntl(sockfd,3,0);
    fcntl(sockfd,4,(ulong)(uVar2 | 0x800));
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int set_noblock(int sockfd)
{
    if(sockfd < 0)
    {
        cout<<"sockfd is invailed"<<endl;
        return -1;
    }
    int flags = fcntl(sockfd,F_GETFL,0);
    fcntl(sockfd,F_SETFL,flags | O_NONBLOCK);
    return 1;
}